

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_assert.h
# Opt level: O3

void TestEq<flexbuffers::Type,flexbuffers::Type>
               (Type expval,Type val,char *exp,char *file,int line,char *func)

{
  _Alloc_hider expval_00;
  string local_70;
  string local_50;
  
  if (expval != val) {
    flatbuffers::NumToString<unsigned_int>(&local_50,expval);
    expval_00._M_p = local_50._M_dataplus._M_p;
    flatbuffers::NumToString<unsigned_int>(&local_70,val);
    TestFail(expval_00._M_p,local_70._M_dataplus._M_p,exp,file,line,func);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void TestEq(T expval, U val, const char *exp, const char *file, int line,
            const char *func) {
  if (static_cast<U>(expval) != val) {
    TestFail(flatbuffers::NumToString(scalar_as_underlying(expval)).c_str(),
             flatbuffers::NumToString(scalar_as_underlying(val)).c_str(), exp,
             file, line, func);
  }
}